

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cpp
# Opt level: O3

void asmjit::v1_14::DebugUtils::assertionFailed(char *file,int line,char *msg)

{
  char str [1024];
  char acStack_408 [1024];
  
  snprintf(acStack_408,0x400,"[asmjit] Assertion failed at %s (line %d):\n[asmjit] %s\n",file,
           (ulong)(uint)line,msg);
  debugOutput(acStack_408);
  abort();
}

Assistant:

ASMJIT_FAVOR_SIZE void DebugUtils::assertionFailed(const char* file, int line, const char* msg) noexcept {
  char str[1024];

  snprintf(str, 1024,
    "[asmjit] Assertion failed at %s (line %d):\n"
    "[asmjit] %s\n", file, line, msg);

  debugOutput(str);
  ::abort();
}